

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O1

int __thiscall MeCab::Writer::open(Writer *this,char *__file,int __oflag,...)

{
  whatlog *this_00;
  size_type sVar1;
  size_t __n;
  int iVar2;
  ostream *poVar3;
  code *pcVar4;
  string ostyle;
  string node_format2;
  string eos_format;
  string bos_format;
  string unk_format;
  string node_format;
  string node_format_key;
  string eon_format;
  string eon_format_key;
  string unk_format_key;
  string eos_format_key;
  string bos_format_key;
  string eos_format2;
  string bos_format2;
  string unk_format2;
  string eon_format2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  char *local_1f0;
  size_t local_1e8;
  char local_1e0 [16];
  char *local_1d0;
  size_t local_1c8;
  char local_1c0 [16];
  char *local_1b0;
  size_t local_1a8;
  char local_1a0 [16];
  char *local_190;
  size_t local_188;
  char local_180 [16];
  char *local_170 [2];
  char local_160 [16];
  char *local_150;
  size_t local_148;
  char local_140 [16];
  char *local_130 [2];
  char local_120 [16];
  char *local_110 [2];
  char local_100 [16];
  char *local_f0 [2];
  char local_e0 [16];
  char *local_d0 [2];
  char local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Param::get<std::__cxx11::string>(&local_230,(Param *)__file,"output-format-type");
  this->write_ = (offset_in_Writer_to_subr)writeLattice;
  *(undefined8 *)&this->field_0x1f8 = 0;
  iVar2 = std::__cxx11::string::compare((char *)&local_230);
  if (iVar2 == 0) {
    pcVar4 = writeWakati;
LAB_0012e224:
    this->write_ = (offset_in_Writer_to_subr)pcVar4;
    *(undefined8 *)&this->field_0x1f8 = 0;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_230);
    if (iVar2 == 0) {
      pcVar4 = writeNone;
      goto LAB_0012e224;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_230);
    if (iVar2 == 0) {
      pcVar4 = writeDump;
      goto LAB_0012e224;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_230);
    if (iVar2 == 0) {
      pcVar4 = writeEM;
      goto LAB_0012e224;
    }
    local_190 = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"%m\\t%H\\n","");
    local_1b0 = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"%m\\t%H\\n","");
    local_1d0 = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
    local_1f0 = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"EOS\\n","");
    local_150 = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
    local_170[0] = local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"node-format","");
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"bos-format","");
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"eos-format","");
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"unk-format","");
    local_130[0] = local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"eon-format","");
    if (local_230._M_string_length == 0) {
LAB_0012e07a:
      Param::get<std::__cxx11::string>(&local_210,(Param *)__file,local_170[0]);
      Param::get<std::__cxx11::string>(&local_90,(Param *)__file,local_d0[0]);
      Param::get<std::__cxx11::string>(&local_b0,(Param *)__file,local_f0[0]);
      Param::get<std::__cxx11::string>(&local_70,(Param *)__file,local_110[0]);
      Param::get<std::__cxx11::string>(&local_50,(Param *)__file,local_130[0]);
      __n = local_188;
      sVar1 = local_210._M_string_length;
      if (local_188 == local_210._M_string_length) {
        if ((((((local_188 != 0) &&
               (iVar2 = bcmp(local_190,local_210._M_dataplus._M_p,local_188), iVar2 != 0)) ||
              (local_1c8 != local_90._M_string_length)) ||
             (((local_1c8 != 0 &&
               (iVar2 = bcmp(local_1d0,local_90._M_dataplus._M_p,local_1c8), iVar2 != 0)) ||
              ((local_1e8 != local_b0._M_string_length ||
               ((local_1e8 != 0 &&
                (iVar2 = bcmp(local_1f0,local_b0._M_dataplus._M_p,local_1e8), iVar2 != 0)))))))) ||
            (local_1a8 != local_70._M_string_length)) ||
           ((local_1a8 != 0 &&
            (iVar2 = bcmp(local_1b0,local_70._M_dataplus._M_p,local_1a8), iVar2 != 0)))) {
          this->write_ = (offset_in_Writer_to_subr)writeUser;
          *(undefined8 *)&this->field_0x1f8 = 0;
          if ((__n != sVar1) ||
             ((__n != 0 && (iVar2 = bcmp(local_190,local_210._M_dataplus._M_p,__n), iVar2 != 0))))
          goto LAB_0012e278;
          goto LAB_0012e28a;
        }
      }
      else {
        this->write_ = (offset_in_Writer_to_subr)writeUser;
        *(undefined8 *)&this->field_0x1f8 = 0;
LAB_0012e278:
        std::__cxx11::string::_M_assign((string *)&local_190);
LAB_0012e28a:
        if ((local_1c8 != local_90._M_string_length) ||
           ((local_1c8 != 0 &&
            (iVar2 = bcmp(local_1d0,local_90._M_dataplus._M_p,local_1c8), iVar2 != 0)))) {
          std::__cxx11::string::_M_assign((string *)&local_1d0);
        }
        if ((local_1e8 != local_b0._M_string_length) ||
           ((local_1e8 != 0 &&
            (iVar2 = bcmp(local_1f0,local_b0._M_dataplus._M_p,local_1e8), iVar2 != 0)))) {
          std::__cxx11::string::_M_assign((string *)&local_1f0);
        }
        if ((local_1a8 == local_70._M_string_length) &&
           ((((local_1a8 == 0 ||
              (iVar2 = bcmp(local_1b0,local_70._M_dataplus._M_p,local_1a8), iVar2 == 0)) &&
             (local_188 == local_210._M_string_length)) && (local_188 != 0)))) {
          bcmp(local_190,local_210._M_dataplus._M_p,local_188);
        }
        std::__cxx11::string::_M_assign((string *)&local_1b0);
        if ((local_148 != local_50._M_string_length) ||
           ((local_148 != 0 &&
            (iVar2 = bcmp(local_150,local_50._M_dataplus._M_p,local_148), iVar2 != 0)))) {
          std::__cxx11::string::_M_assign((string *)&local_150);
        }
        scoped_string::reset_string(&this->node_format_,local_190);
        scoped_string::reset_string(&this->bos_format_,local_1d0);
        scoped_string::reset_string(&this->eos_format_,local_1f0);
        scoped_string::reset_string(&this->unk_format_,local_1b0);
        this = (Writer *)&this->eon_format_;
        scoped_string::reset_string((scoped_string *)this,local_150);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      this = (Writer *)CONCAT71((int7)((ulong)this >> 8),1);
    }
    else {
      std::__cxx11::string::append((char *)local_170);
      std::__cxx11::string::_M_append((char *)local_170,(ulong)local_230._M_dataplus._M_p);
      std::__cxx11::string::append((char *)local_d0);
      std::__cxx11::string::_M_append((char *)local_d0,(ulong)local_230._M_dataplus._M_p);
      std::__cxx11::string::append((char *)local_f0);
      std::__cxx11::string::_M_append((char *)local_f0,(ulong)local_230._M_dataplus._M_p);
      std::__cxx11::string::append((char *)local_110);
      std::__cxx11::string::_M_append((char *)local_110,(ulong)local_230._M_dataplus._M_p);
      std::__cxx11::string::append((char *)local_130);
      std::__cxx11::string::_M_append((char *)local_130,(ulong)local_230._M_dataplus._M_p);
      Param::get<std::__cxx11::string>(&local_210,(Param *)__file,local_170[0]);
      sVar1 = local_210._M_string_length;
      if (local_210._M_string_length == 0) {
        this_00 = &this->what_;
        std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/writer.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"(",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)this_00,0x3f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!tmp.empty()",0xc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"unkown format type [",0x14);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_230._M_dataplus._M_p,local_230._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if (sVar1 != 0) goto LAB_0012e07a;
      this = (Writer *)0x0;
    }
    if (local_130[0] != local_120) {
      operator_delete(local_130[0]);
    }
    if (local_110[0] != local_100) {
      operator_delete(local_110[0]);
    }
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0]);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    if (local_170[0] != local_160) {
      operator_delete(local_170[0]);
    }
    if (local_150 != local_140) {
      operator_delete(local_150);
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0);
    }
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0);
    }
    if (local_190 != local_180) {
      operator_delete(local_190);
    }
    if ((char)this == '\0') {
      iVar2 = 0;
      goto LAB_0012e238;
    }
  }
  iVar2 = (int)CONCAT71((int7)((ulong)this >> 8),1);
LAB_0012e238:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  return iVar2;
}

Assistant:

bool Writer::open(const Param &param) {
  const std::string ostyle = param.get<std::string>("output-format-type");
  write_ = &Writer::writeLattice;

  if (ostyle == "wakati") {
    write_ = &Writer::writeWakati;
  } else if (ostyle == "none") {
    write_ = &Writer::writeNone;
  } else if (ostyle == "dump") {
    write_ = &Writer::writeDump;
  } else if (ostyle == "em") {
    write_ = &Writer::writeEM;
  } else {
    // default values
    std::string node_format = "%m\\t%H\\n";
    std::string unk_format  = "%m\\t%H\\n";
    std::string bos_format  = "";
    std::string eos_format  = "EOS\\n";
    std::string eon_format  = "";

    std::string node_format_key = "node-format";
    std::string bos_format_key  = "bos-format";
    std::string eos_format_key  = "eos-format";
    std::string unk_format_key  = "unk-format";
    std::string eon_format_key  = "eon-format";

    if (!ostyle.empty()) {
      node_format_key += "-";
      node_format_key += ostyle;
      bos_format_key += "-";
      bos_format_key += ostyle;
      eos_format_key += "-";
      eos_format_key += ostyle;
      unk_format_key += "-";
      unk_format_key += ostyle;
      eon_format_key += "-";
      eon_format_key += ostyle;
      const std::string tmp = param.get<std::string>(node_format_key.c_str());
      CHECK_FALSE(!tmp.empty()) << "unkown format type [" << ostyle << "]";
    }

    const std::string node_format2 =
        param.get<std::string>(node_format_key.c_str());
    const std::string bos_format2 =
        param.get<std::string>(bos_format_key.c_str());
    const std::string eos_format2 =
        param.get<std::string>(eos_format_key.c_str());
    const std::string unk_format2 =
        param.get<std::string>(unk_format_key.c_str());
    const std::string eon_format2 =
        param.get<std::string>(eon_format_key.c_str());

    if (node_format != node_format2 || bos_format != bos_format2 ||
        eos_format != eos_format2 || unk_format != unk_format2) {
      write_ = &Writer::writeUser;
      if (node_format != node_format2) {
        node_format = node_format2;
      }
      if (bos_format != bos_format2) {
        bos_format = bos_format2;
      }
      if (eos_format != eos_format2) {
        eos_format = eos_format2;
      }
      if (unk_format != unk_format2) {
        unk_format = unk_format2;
      } else if (node_format != node_format2) {
        unk_format = node_format2;
      } else {
        unk_format = node_format;
      }
      if (eon_format != eon_format2) {
        eon_format = eon_format2;
      }
      node_format_.reset_string(node_format.c_str());
      bos_format_.reset_string(bos_format.c_str());
      eos_format_.reset_string(eos_format.c_str());
      unk_format_.reset_string(unk_format.c_str());
      eon_format_.reset_string(eon_format.c_str());
    }
  }

  return true;
}